

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O3

int32_t ucase_getCaseLocale_63(char *locale)

{
  int32_t iVar1;
  byte bVar2;
  byte *pbVar3;
  
  bVar2 = *locale;
  if (bVar2 == 0x7a) {
    return 1;
  }
  if (bVar2 == 0x65) {
LAB_002a7ded:
    if ((locale[1] & 0xdfU) != 0x4c) {
      return 1;
    }
    bVar2 = locale[2];
    if ((bVar2 & 0xdf) == 0x4c) {
      bVar2 = locale[3];
    }
    iVar1 = 4;
  }
  else {
    if ((char)bVar2 < 'a') {
      if (bVar2 < 0x4c) {
        if (bVar2 == 0x41) goto LAB_002a7ec8;
        if (bVar2 != 0x45) {
          return 1;
        }
        goto LAB_002a7ded;
      }
      if (bVar2 == 0x4c) goto LAB_002a7e91;
      if (bVar2 == 0x4e) goto LAB_002a7ea7;
      if (bVar2 != 0x54) {
        return 1;
      }
    }
    else {
      if (bVar2 < 0x6e) {
        if (bVar2 != 0x61) {
          if (bVar2 != 0x6c) {
            return 1;
          }
LAB_002a7e91:
          bVar2 = locale[1];
          if ((bVar2 & 0xdf) == 0x49) {
            bVar2 = locale[2];
            pbVar3 = (byte *)(locale + 3);
          }
          else {
            pbVar3 = (byte *)(locale + 2);
          }
          if ((bVar2 & 0xdf) != 0x54) {
            return 1;
          }
          bVar2 = *pbVar3;
          iVar1 = 3;
          goto joined_r0x002a7f11;
        }
LAB_002a7ec8:
        if ((locale[1] & 0xdfU) != 0x5a) {
          return 1;
        }
        bVar2 = locale[2];
        if ((bVar2 & 0xdf) == 0x45) {
          bVar2 = locale[3];
        }
        iVar1 = 2;
        goto joined_r0x002a7f11;
      }
      if (bVar2 == 0x6e) {
LAB_002a7ea7:
        if ((locale[1] & 0xdfU) != 0x4c) {
          return 1;
        }
        bVar2 = locale[2];
        if ((bVar2 & 0xdf) == 0x44) {
          bVar2 = locale[3];
        }
        iVar1 = 5;
        goto joined_r0x002a7f11;
      }
      if (bVar2 != 0x74) {
        return 1;
      }
    }
    bVar2 = locale[1];
    if ((bVar2 & 0xdf) == 0x55) {
      bVar2 = locale[2];
      pbVar3 = (byte *)(locale + 3);
    }
    else {
      pbVar3 = (byte *)(locale + 2);
    }
    if ((bVar2 & 0xdf) != 0x52) {
      return 1;
    }
    bVar2 = *pbVar3;
    iVar1 = 2;
  }
joined_r0x002a7f11:
  if (bVar2 == 0) {
    return iVar1;
  }
  if (bVar2 != 0x2d) {
    if (bVar2 != 0x5f) {
      return 1;
    }
    return iVar1;
  }
  return iVar1;
}

Assistant:

U_CFUNC int32_t
ucase_getCaseLocale(const char *locale) {
    /*
     * This function used to use uloc_getLanguage(), but the current code
     * removes the dependency of this low-level code on uloc implementation code
     * and is faster because not the whole locale ID has to be
     * examined and copied/transformed.
     *
     * Because this code does not want to depend on uloc, the caller must
     * pass in a non-NULL locale, i.e., may need to call uloc_getDefault().
     */
    char c=*locale++;
    // Fastpath for English "en" which is often used for default (=root locale) case mappings,
    // and for Chinese "zh": Very common but no special case mapping behavior.
    // Then check lowercase vs. uppercase to reduce the number of comparisons
    // for other locales without special behavior.
    if(c=='e') {
        /* el or ell? */
        c=*locale++;
        if(is_l(c)) {
            c=*locale++;
            if(is_l(c)) {
                c=*locale;
            }
            if(is_sep(c)) {
                return UCASE_LOC_GREEK;
            }
        }
        // en, es, ... -> root
    } else if(c=='z') {
        return UCASE_LOC_ROOT;
#if U_CHARSET_FAMILY==U_ASCII_FAMILY
    } else if(c>='a') {  // ASCII a-z = 0x61..0x7a, after A-Z
#elif U_CHARSET_FAMILY==U_EBCDIC_FAMILY
    } else if(c<='z') {  // EBCDIC a-z = 0x81..0xa9 with two gaps, before A-Z
#else
#   error Unknown charset family!
#endif
        // lowercase c
        if(c=='t') {
            /* tr or tur? */
            c=*locale++;
            if(is_u(c)) {
                c=*locale++;
            }
            if(is_r(c)) {
                c=*locale;
                if(is_sep(c)) {
                    return UCASE_LOC_TURKISH;
                }
            }
        } else if(c=='a') {
            /* az or aze? */
            c=*locale++;
            if(is_z(c)) {
                c=*locale++;
                if(is_e(c)) {
                    c=*locale;
                }
                if(is_sep(c)) {
                    return UCASE_LOC_TURKISH;
                }
            }
        } else if(c=='l') {
            /* lt or lit? */
            c=*locale++;
            if(is_i(c)) {
                c=*locale++;
            }
            if(is_t(c)) {
                c=*locale;
                if(is_sep(c)) {
                    return UCASE_LOC_LITHUANIAN;
                }
            }
        } else if(c=='n') {
            /* nl or nld? */
            c=*locale++;
            if(is_l(c)) {
                c=*locale++;
                if(is_d(c)) {
                    c=*locale;
                }
                if(is_sep(c)) {
                    return UCASE_LOC_DUTCH;
                }
            }
        }
    } else {
        // uppercase c
        // Same code as for lowercase c but also check for 'E'.
        if(c=='T') {
            /* tr or tur? */
            c=*locale++;
            if(is_u(c)) {
                c=*locale++;
            }
            if(is_r(c)) {
                c=*locale;
                if(is_sep(c)) {
                    return UCASE_LOC_TURKISH;
                }
            }
        } else if(c=='A') {
            /* az or aze? */
            c=*locale++;
            if(is_z(c)) {
                c=*locale++;
                if(is_e(c)) {
                    c=*locale;
                }
                if(is_sep(c)) {
                    return UCASE_LOC_TURKISH;
                }
            }
        } else if(c=='L') {
            /* lt or lit? */
            c=*locale++;
            if(is_i(c)) {
                c=*locale++;
            }
            if(is_t(c)) {
                c=*locale;
                if(is_sep(c)) {
                    return UCASE_LOC_LITHUANIAN;
                }
            }
        } else if(c=='E') {
            /* el or ell? */
            c=*locale++;
            if(is_l(c)) {
                c=*locale++;
                if(is_l(c)) {
                    c=*locale;
                }
                if(is_sep(c)) {
                    return UCASE_LOC_GREEK;
                }
            }
        } else if(c=='N') {
            /* nl or nld? */
            c=*locale++;
            if(is_l(c)) {
                c=*locale++;
                if(is_d(c)) {
                    c=*locale;
                }
                if(is_sep(c)) {
                    return UCASE_LOC_DUTCH;
                }
            }
        }
    }
    return UCASE_LOC_ROOT;
}